

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

GrowingAlignedDataBuffer * __thiscall
siamese::EncoderPacketWindow::GetSum
          (EncoderPacketWindow *this,uint laneIndex,uint sumIndex,uint elementEnd)

{
  OriginalPacket *pOVar1;
  ostringstream *this_00;
  GrowingAlignedDataBuffer *this_01;
  uint uVar2;
  EncoderSubwindow *pEVar3;
  bool bVar4;
  uint uVar5;
  OutputWorker *this_02;
  uint8_t y;
  uint uVar6;
  uint uVar7;
  undefined1 local_1b8 [392];
  
  uVar7 = this->Lanes[laneIndex].NextElement[sumIndex];
  if (uVar7 < elementEnd) {
    uVar2 = this->Lanes[laneIndex].LongestPacket;
    this_01 = this->Lanes[laneIndex].Sum + sumIndex;
    if ((uVar2 == 0) ||
       (bVar4 = GrowingAlignedDataBuffer::GrowZeroPadded(this_01,this->TheAllocator,uVar2), bVar4))
    {
      this_00 = (ostringstream *)(local_1b8 + 0x10);
      do {
        if (DAT_001b9078 < 3) {
          local_1b8._0_8_ = Logger;
          local_1b8._8_4_ = Info;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,DAT_001b90a8,DAT_001b90b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Lane ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," sum ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," accumulating column: ",0x16);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          this_02 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
        }
        pEVar3 = (this->Subwindows).DataPtr[uVar7 >> 6];
        uVar5 = uVar7 & 0x3f;
        uVar2 = (pEVar3->Originals)._M_elems[uVar5].Buffer.Bytes;
        uVar6 = (pEVar3->Originals)._M_elems[uVar5].Column;
        bVar4 = GrowingAlignedDataBuffer::GrowZeroPadded(this_01,this->TheAllocator,uVar2);
        if (!bVar4) goto LAB_0014a572;
        pOVar1 = (pEVar3->Originals)._M_elems + uVar5;
        if (sumIndex == 0) {
          gf256_add_mem(this_01->Data,(pOVar1->Buffer).Data,uVar2);
        }
        else {
          uVar6 = (uVar6 * 199) % 0xfd;
          y = (char)uVar6 + '\x03';
          if (sumIndex == 2) {
            y = GF256Ctx.GF256_SQR_TABLE[(ulong)uVar6 + 3];
          }
          gf256_muladd_mem(this_01->Data,y,(pOVar1->Buffer).Data,uVar2);
        }
        uVar7 = uVar7 + 8;
      } while (uVar7 < elementEnd);
      this->Lanes[laneIndex].NextElement[sumIndex] = uVar7;
    }
    else {
LAB_0014a572:
      this->EmergencyDisabled = true;
    }
  }
  return this->Lanes[laneIndex].Sum + sumIndex;
}

Assistant:

const GrowingAlignedDataBuffer* EncoderPacketWindow::GetSum(unsigned laneIndex, unsigned sumIndex, unsigned elementEnd)
{
    EncoderColumnLane& lane = Lanes[laneIndex];
    unsigned element = lane.NextElement[sumIndex];
    SIAMESE_DEBUG_ASSERT(element % kColumnLaneCount == laneIndex);
    SIAMESE_DEBUG_ASSERT(element < Count + kColumnLaneCount);

    if (element < elementEnd)
    {
        GrowingAlignedDataBuffer& sum = lane.Sum[sumIndex];

        // Grow this sum for this lane to fit new (larger) data if needed
        if (lane.LongestPacket > 0 &&
            !sum.GrowZeroPadded(TheAllocator, lane.LongestPacket))
        {
            EmergencyDisabled = true;
            goto ExitSum;
        }

        do
        {
            Logger.Info("Lane ", laneIndex, " sum ", sumIndex, " accumulating column: ", ColumnStart + element);

            OriginalPacket* original = GetWindowElement(element);
            const unsigned column    = original->Column;
            unsigned addBytes        = original->Buffer.Bytes;

            if (!sum.GrowZeroPadded(TheAllocator, addBytes))
            {
                EmergencyDisabled = true;
                goto ExitSum;
            }

            SIAMESE_DEBUG_ASSERT(original->Buffer.Bytes <= sum.Bytes || element < FirstUnremovedElement);

            // Sum += PacketData
            if (sumIndex == 0) {
                gf256_add_mem(sum.Data, original->Buffer.Data, addBytes);
            }
            else
            {
                // Sum += CX[2] * PacketData
                uint8_t CX = GetColumnValue(column);
                if (sumIndex == 2) {
                    CX = gf256_sqr(CX);
                }
                gf256_muladd_mem(sum.Data, CX, original->Buffer.Data, addBytes);
            }

            SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == laneIndex);
            element += kColumnLaneCount;
        } while (element < elementEnd);

        // Store next element to accumulate
        lane.NextElement[sumIndex] = element;
    }

ExitSum:
    return &lane.Sum[sumIndex];
}